

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLLibraryKinematicsScenesLoader15.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL::LibraryKinematicsScenesLoader15::begin__instance_kinematics_model
          (LibraryKinematicsScenesLoader15 *this,
          instance_kinematics_model__AttributeData *attributeData)

{
  byte bVar1;
  undefined4 *in_RSI;
  long in_RDI;
  instance_kinematics_model__AttributeData attrData;
  URI *in_stack_fffffffffffffec8;
  undefined7 in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed7;
  undefined4 local_110 [60];
  undefined8 local_20;
  undefined8 local_18;
  undefined4 *local_10;
  
  local_10 = in_RSI;
  instance_kinematics_model__AttributeData::instance_kinematics_model__AttributeData
            ((instance_kinematics_model__AttributeData *)0xc2a0be);
  local_110[0] = *local_10;
  COLLADABU::URI::operator=
            ((URI *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
             in_stack_fffffffffffffec8);
  local_20 = *(undefined8 *)(local_10 + 0x3c);
  local_18 = *(undefined8 *)(local_10 + 0x3e);
  bVar1 = (**(code **)(**(long **)(in_RDI + 0x18) + 0x98))(*(long **)(in_RDI + 0x18),local_110);
  instance_kinematics_model__AttributeData::~instance_kinematics_model__AttributeData
            ((instance_kinematics_model__AttributeData *)0xc2a13c);
  return (bool)(bVar1 & 1);
}

Assistant:

bool LibraryKinematicsScenesLoader15::begin__instance_kinematics_model( const COLLADASaxFWL15::instance_kinematics_model__AttributeData& attributeData )
{
SaxVirtualFunctionTest15(begin__instance_kinematics_model(attributeData));
COLLADASaxFWL::instance_kinematics_model__AttributeData attrData;
attrData.present_attributes = attributeData.present_attributes;
attrData.url = attributeData.url;
attrData.sid = attributeData.sid;
attrData.name = attributeData.name;
return mLoader->begin__instance_kinematics_model(attrData);
}